

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

FloatImageTexture *
pbrt::FloatImageTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Alloc_hider __s1;
  bool invert;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  WrapMode wm;
  ulong uVar6;
  Float FVar7;
  Float scale;
  string encodingString;
  string filename;
  string wrapString;
  string local_a0;
  string local_80;
  string filter;
  ColorEncodingHandle encoding;
  TextureMapping2DHandle map;
  
  TextureMapping2DHandle::Create(&map,parameters->dict,renderFromTexture,loc,alloc);
  paVar1 = &wrapString.field_2;
  wrapString._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&wrapString,"maxanisotropy","");
  FVar7 = TextureParameterDictionary::GetOneFloat(parameters,&wrapString,8.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wrapString._M_dataplus._M_p != paVar1) {
    operator_delete(wrapString._M_dataplus._M_p,
                    CONCAT71(wrapString.field_2._M_allocated_capacity._1_7_,
                             wrapString.field_2._M_local_buf[0]) + 1);
  }
  wrapString._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&wrapString,"filter","");
  paVar2 = &filename.field_2;
  filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filename,"bilinear","");
  TextureParameterDictionary::GetOneString(&filter,parameters,&wrapString,&filename);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wrapString._M_dataplus._M_p != paVar1) {
    operator_delete(wrapString._M_dataplus._M_p,
                    CONCAT71(wrapString.field_2._M_allocated_capacity._1_7_,
                             wrapString.field_2._M_local_buf[0]) + 1);
  }
  iVar4 = std::__cxx11::string::compare((char *)&filter);
  uVar6 = 3;
  if (iVar4 != 0) {
    iVar4 = std::__cxx11::string::compare((char *)&filter);
    if (iVar4 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)&filter);
      if (iVar4 == 0) {
        uVar6 = 2;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&filter);
        if (iVar4 == 0) {
          uVar6 = 1;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&filter);
          if (iVar4 == 0) {
            uVar6 = 0;
          }
          else {
            wrapString._M_string_length = 0;
            wrapString.field_2._M_local_buf[0] = '\0';
            wrapString._M_dataplus._M_p = (pointer)paVar1;
            detail::stringPrintfRecursive<std::__cxx11::string&>
                      (&wrapString,"%s: filter function unknown",&filter);
            Error(loc,wrapString._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)wrapString._M_dataplus._M_p != paVar1) {
              operator_delete(wrapString._M_dataplus._M_p,
                              CONCAT71(wrapString.field_2._M_allocated_capacity._1_7_,
                                       wrapString.field_2._M_local_buf[0]) + 1);
            }
          }
        }
      }
    }
  }
  filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filename,"wrap","");
  encodingString._M_dataplus._M_p = (pointer)&encodingString.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encodingString,"repeat","");
  TextureParameterDictionary::GetOneString(&wrapString,parameters,&filename,&encodingString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encodingString._M_dataplus._M_p != &encodingString.field_2) {
    operator_delete(encodingString._M_dataplus._M_p,encodingString.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  __s1._M_p = wrapString._M_dataplus._M_p;
  iVar4 = strcmp(wrapString._M_dataplus._M_p,"clamp");
  if (iVar4 == 0) {
    wm = Clamp;
  }
  else {
    iVar4 = strcmp(__s1._M_p,"repeat");
    if (iVar4 == 0) {
      wm = Repeat;
    }
    else {
      iVar4 = strcmp(__s1._M_p,"black");
      if (iVar4 == 0) {
        wm = Black;
      }
      else {
        iVar4 = strcmp(__s1._M_p,"octahedralsphere");
        wm = OctahedralSphere;
        if (iVar4 != 0) {
          ErrorExit<std::__cxx11::string&>("%s: wrap mode unknown",&wrapString);
        }
      }
    }
  }
  filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filename,"scale","");
  scale = TextureParameterDictionary::GetOneFloat(parameters,&filename,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filename,"invert","");
  invert = TextureParameterDictionary::GetOneBool(parameters,&filename,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"filename","");
  paVar2 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  TextureParameterDictionary::GetOneString(&encodingString,parameters,&local_80,&local_a0);
  ResolveFilename(&filename,&encodingString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encodingString._M_dataplus._M_p != &encodingString.field_2) {
    operator_delete(encodingString._M_dataplus._M_p,encodingString.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  encodingString._M_dataplus._M_p = (pointer)&encodingString.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encodingString,"png","");
  bVar3 = HasExtension(&filename,&encodingString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encodingString._M_dataplus._M_p != &encodingString.field_2) {
    operator_delete(encodingString._M_dataplus._M_p,encodingString.field_2._M_allocated_capacity + 1
                   );
  }
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"encoding","");
  pcVar5 = "linear";
  if (bVar3) {
    pcVar5 = "sRGB";
  }
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,pcVar5,pcVar5 + (ulong)!bVar3 * 2 + 4);
  TextureParameterDictionary::GetOneString(&encodingString,parameters,&local_80,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  ColorEncodingHandle::Get((string *)&encoding,(memory_resource *)&encodingString);
  iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  local_80._M_dataplus._M_p =
       (pointer)map.
                super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
                .bits;
  local_a0._M_dataplus._M_p =
       (pointer)encoding.
                super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                .bits;
  FloatImageTexture((FloatImageTexture *)CONCAT44(extraout_var,iVar4),
                    (TextureMapping2DHandle *)&local_80,&filename,
                    (MIPMapFilterOptions)(uVar6 | (ulong)(uint)FVar7 << 0x20),wm,scale,invert,
                    (ColorEncodingHandle)&local_a0,alloc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encodingString._M_dataplus._M_p != &encodingString.field_2) {
    operator_delete(encodingString._M_dataplus._M_p,encodingString.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wrapString._M_dataplus._M_p != &wrapString.field_2) {
    operator_delete(wrapString._M_dataplus._M_p,
                    CONCAT71(wrapString.field_2._M_allocated_capacity._1_7_,
                             wrapString.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filter._M_dataplus._M_p != &filter.field_2) {
    operator_delete(filter._M_dataplus._M_p,filter.field_2._M_allocated_capacity + 1);
  }
  return (FloatImageTexture *)CONCAT44(extraout_var,iVar4);
}

Assistant:

FloatImageTexture *FloatImageTexture::Create(const Transform &renderFromTexture,
                                             const TextureParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    // Initialize _ImageTexture_ parameters
    Float maxAniso = parameters.GetOneFloat("maxanisotropy", 8.f);
    std::string filter = parameters.GetOneString("filter", "bilinear");
    MIPMapFilterOptions filterOptions;
    filterOptions.maxAnisotropy = maxAniso;
    pstd::optional<FilterFunction> ff = ParseFilter(filter);
    if (ff)
        filterOptions.filter = *ff;
    else
        Error(loc, "%s: filter function unknown", filter);

    std::string wrapString = parameters.GetOneString("wrap", "repeat");
    pstd::optional<WrapMode> wrapMode = ParseWrapMode(wrapString.c_str());
    if (!wrapMode)
        ErrorExit("%s: wrap mode unknown", wrapString);
    Float scale = parameters.GetOneFloat("scale", 1.f);
    bool invert = parameters.GetOneBool("invert", false);
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));

    const char *defaultEncoding = HasExtension(filename, "png") ? "sRGB" : "linear";
    std::string encodingString = parameters.GetOneString("encoding", defaultEncoding);
    ColorEncodingHandle encoding = ColorEncodingHandle::Get(encodingString, alloc);

    return alloc.new_object<FloatImageTexture>(map, filename, filterOptions, *wrapMode,
                                               scale, invert, encoding, alloc);
}